

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O1

SnapshotCompletionResult __thiscall
ChainstateManager::MaybeCompleteSnapshotValidation(ChainstateManager *this)

{
  int iVar1;
  long lVar2;
  _Head_base<0UL,_Chainstate_*,_false> _Var3;
  pointer ppCVar4;
  uint256 *puVar5;
  CoinsViews *view;
  CChainParams *pCVar6;
  pointer pAVar7;
  SnapshotCompletionResult SVar8;
  Chainstate *pCVar9;
  CBlockIndex *pCVar10;
  optional<int> *poVar11;
  CBlockIndex **ppCVar12;
  optional<uint256> *poVar13;
  unique_ptr<CoinsViews,_std::default_delete<CoinsViews>_> *puVar14;
  long lVar15;
  pointer pAVar16;
  undefined8 *puVar17;
  long in_FS_OFFSET;
  byte bVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view source_file_04;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  string_view logging_function_04;
  int curr_height;
  anon_class_24_3_af36e733 handle_invalid_snapshot;
  int snapshot_base_height;
  int snapshot_tip_height;
  _Any_data local_298;
  code *local_288;
  code *pcStack_280;
  undefined1 local_270 [216];
  optional<kernel::CCoinsStats> maybe_ibd_stats;
  undefined8 local_c0;
  uchar uStack_b8;
  uchar uStack_b7;
  uchar uStack_b6;
  uchar uStack_b5;
  uchar uStack_b4;
  uchar uStack_b3;
  uchar uStack_b2;
  uchar uStack_b1;
  uchar uStack_b0;
  uchar uStack_af;
  uchar uStack_ae;
  uchar uStack_ad;
  uchar local_ac;
  uchar uStack_ab;
  uchar uStack_aa;
  uchar uStack_a9;
  uchar uStack_a8;
  uchar uStack_a7;
  uchar uStack_a6;
  uchar uStack_a5;
  uchar uStack_a4;
  uchar uStack_a3;
  uchar uStack_a2;
  uchar uStack_a1;
  uchar uStack_a0;
  uchar uStack_9f;
  uchar uStack_9e;
  uchar uStack_9d;
  char local_70;
  uint256 snapshot_blockhash;
  
  bVar18 = 0;
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  _Var3._M_head_impl =
       (this->m_ibd_chainstate)._M_t.
       super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
       super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
       super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl;
  pCVar9 = ActiveChainstate(this);
  SVar8 = SKIPPED;
  if (((((_Var3._M_head_impl != pCVar9) &&
        (pCVar9 = (this->m_snapshot_chainstate)._M_t.
                  super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
                  super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
                  super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl,
        pCVar9 != (Chainstate *)0x0)) && (pCVar9->m_disabled == false)) &&
      ((_Var3._M_head_impl =
             (this->m_ibd_chainstate)._M_t.
             super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
             super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
             super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl,
       _Var3._M_head_impl != (Chainstate *)0x0 && ((_Var3._M_head_impl)->m_disabled == false)))) &&
     ((ppCVar4 = *(pointer *)((long)&(_Var3._M_head_impl)->m_chain + 8),
      ppCVar4 != *(pointer *)&((_Var3._M_head_impl)->m_chain).vChain &&
      (ppCVar4[0xffffffffffffffff] != (CBlockIndex *)0x0)))) {
    pCVar9 = ActiveChainstate(this);
    snapshot_tip_height =
         (int)((ulong)((long)(pCVar9->m_chain).vChain.
                             super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(pCVar9->m_chain).vChain.
                            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                            _M_impl.super__Vector_impl_data._M_start) >> 3) + -1;
    if (this->m_active_chainstate == (Chainstate *)0x0) {
      pCVar10 = (CBlockIndex *)0x0;
    }
    else {
      pCVar10 = Chainstate::SnapshotBase(this->m_active_chainstate);
    }
    if (pCVar10 == (CBlockIndex *)0x0) {
      maybe_ibd_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>._M_payload.
      super__Optional_payload_base<kernel::CCoinsStats>._M_payload._0_8_ = 0;
    }
    else {
      maybe_ibd_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>._M_payload.
      super__Optional_payload_base<kernel::CCoinsStats>._M_payload._0_8_ =
           (ulong)(uint)pCVar10->nHeight | 0x100000000;
    }
    poVar11 = inline_assertion_check<true,std::optional<int>>
                        ((optional<int> *)&maybe_ibd_stats,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                         ,0x17a9,"MaybeCompleteSnapshotValidation","this->GetSnapshotBaseHeight()");
    snapshot_base_height =
         (poVar11->super__Optional_base<int,_true,_true>)._M_payload.
         super__Optional_payload_base<int>._M_payload._M_value;
    _Var3._M_head_impl =
         (this->m_ibd_chainstate)._M_t.
         super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
         super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
         super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl;
    ppCVar4 = *(pointer *)((long)&(_Var3._M_head_impl)->m_chain + 8);
    if (ppCVar4 == *(pointer *)&((_Var3._M_head_impl)->m_chain).vChain) {
      maybe_ibd_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>._M_payload.
      super__Optional_payload_base<kernel::CCoinsStats>._M_payload._0_8_ = (CBlockIndex *)0x0;
    }
    else {
      maybe_ibd_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>._M_payload.
      super__Optional_payload_base<kernel::CCoinsStats>._M_payload._0_8_ =
           ppCVar4[0xffffffffffffffff];
    }
    ppCVar12 = inline_assertion_check<true,CBlockIndex*>
                         ((CBlockIndex **)&maybe_ibd_stats,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                          ,0x17aa,"MaybeCompleteSnapshotValidation",
                          "m_ibd_chainstate->m_chain.Tip()");
    pCVar10 = *ppCVar12;
    SVar8 = SKIPPED;
    if (snapshot_base_height <= pCVar10->nHeight) {
      SnapshotBlockhash((optional<uint256> *)&maybe_ibd_stats,this);
      if (maybe_ibd_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>._M_payload.
          super__Optional_payload_base<kernel::CCoinsStats>._M_payload._M_value.hashBlock.
          super_base_blob<256U>.m_data._M_elems[0x1c] == '\0') {
        __assert_fail("SnapshotBlockhash()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                      ,0x17b1,
                      "SnapshotCompletionResult ChainstateManager::MaybeCompleteSnapshotValidation()"
                     );
      }
      SnapshotBlockhash((optional<uint256> *)&maybe_ibd_stats,this);
      poVar13 = inline_assertion_check<true,std::optional<uint256>>
                          ((optional<uint256> *)&maybe_ibd_stats,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                           ,0x17b2,"MaybeCompleteSnapshotValidation","SnapshotBlockhash()");
      snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._0_8_ =
           *(undefined8 *)
            &(poVar13->super__Optional_base<uint256,_true,_true>)._M_payload.
             super__Optional_payload_base<uint256>._M_payload;
      snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._8_8_ =
           *(undefined8 *)
            ((long)&(poVar13->super__Optional_base<uint256,_true,_true>)._M_payload.
                    super__Optional_payload_base<uint256>._M_payload + 8);
      snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._16_8_ =
           *(undefined8 *)
            ((long)&(poVar13->super__Optional_base<uint256,_true,_true>)._M_payload.
                    super__Optional_payload_base<uint256>._M_payload + 0x10);
      snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._24_8_ =
           *(undefined8 *)
            ((long)&(poVar13->super__Optional_base<uint256,_true,_true>)._M_payload.
                    super__Optional_payload_base<uint256>._M_payload + 0x18);
      handle_invalid_snapshot.snapshot_tip_height = &snapshot_tip_height;
      puVar5 = pCVar10->phashBlock;
      handle_invalid_snapshot.snapshot_base_height = &snapshot_base_height;
      handle_invalid_snapshot.this = this;
      if (puVar5 == (uint256 *)0x0) {
        __assert_fail("phashBlock != nullptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/chain.h"
                      ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
      }
      auVar21[0] = -((puVar5->super_base_blob<256U>).m_data._M_elems[0x10] ==
                    snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x10]);
      auVar21[1] = -((puVar5->super_base_blob<256U>).m_data._M_elems[0x11] ==
                    snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x11]);
      auVar21[2] = -((puVar5->super_base_blob<256U>).m_data._M_elems[0x12] ==
                    snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x12]);
      auVar21[3] = -((puVar5->super_base_blob<256U>).m_data._M_elems[0x13] ==
                    snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x13]);
      auVar21[4] = -((puVar5->super_base_blob<256U>).m_data._M_elems[0x14] ==
                    snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x14]);
      auVar21[5] = -((puVar5->super_base_blob<256U>).m_data._M_elems[0x15] ==
                    snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x15]);
      auVar21[6] = -((puVar5->super_base_blob<256U>).m_data._M_elems[0x16] ==
                    snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x16]);
      auVar21[7] = -((puVar5->super_base_blob<256U>).m_data._M_elems[0x17] ==
                    snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x17]);
      auVar21[8] = -((puVar5->super_base_blob<256U>).m_data._M_elems[0x18] ==
                    snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x18]);
      auVar21[9] = -((puVar5->super_base_blob<256U>).m_data._M_elems[0x19] ==
                    snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x19]);
      auVar21[10] = -((puVar5->super_base_blob<256U>).m_data._M_elems[0x1a] ==
                     snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x1a]);
      auVar21[0xb] = -((puVar5->super_base_blob<256U>).m_data._M_elems[0x1b] ==
                      snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x1b]);
      auVar21[0xc] = -((puVar5->super_base_blob<256U>).m_data._M_elems[0x1c] ==
                      snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x1c]);
      auVar21[0xd] = -((puVar5->super_base_blob<256U>).m_data._M_elems[0x1d] ==
                      snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x1d]);
      auVar21[0xe] = -((puVar5->super_base_blob<256U>).m_data._M_elems[0x1e] ==
                      snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x1e]);
      auVar21[0xf] = -((puVar5->super_base_blob<256U>).m_data._M_elems[0x1f] ==
                      snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x1f]);
      auVar19[0] = -((puVar5->super_base_blob<256U>).m_data._M_elems[0] ==
                    snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0]);
      auVar19[1] = -((puVar5->super_base_blob<256U>).m_data._M_elems[1] ==
                    snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[1]);
      auVar19[2] = -((puVar5->super_base_blob<256U>).m_data._M_elems[2] ==
                    snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[2]);
      auVar19[3] = -((puVar5->super_base_blob<256U>).m_data._M_elems[3] ==
                    snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[3]);
      auVar19[4] = -((puVar5->super_base_blob<256U>).m_data._M_elems[4] ==
                    snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[4]);
      auVar19[5] = -((puVar5->super_base_blob<256U>).m_data._M_elems[5] ==
                    snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[5]);
      auVar19[6] = -((puVar5->super_base_blob<256U>).m_data._M_elems[6] ==
                    snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[6]);
      auVar19[7] = -((puVar5->super_base_blob<256U>).m_data._M_elems[7] ==
                    snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[7]);
      auVar19[8] = -((puVar5->super_base_blob<256U>).m_data._M_elems[8] ==
                    snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[8]);
      auVar19[9] = -((puVar5->super_base_blob<256U>).m_data._M_elems[9] ==
                    snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[9]);
      auVar19[10] = -((puVar5->super_base_blob<256U>).m_data._M_elems[10] ==
                     snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[10]);
      auVar19[0xb] = -((puVar5->super_base_blob<256U>).m_data._M_elems[0xb] ==
                      snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0xb]);
      auVar19[0xc] = -((puVar5->super_base_blob<256U>).m_data._M_elems[0xc] ==
                      snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0xc]);
      auVar19[0xd] = -((puVar5->super_base_blob<256U>).m_data._M_elems[0xd] ==
                      snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0xd]);
      auVar19[0xe] = -((puVar5->super_base_blob<256U>).m_data._M_elems[0xe] ==
                      snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0xe]);
      auVar19[0xf] = -((puVar5->super_base_blob<256U>).m_data._M_elems[0xf] ==
                      snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0xf]);
      auVar19 = auVar19 & auVar21;
      if ((ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar19[0xf] >> 7) << 0xf) == 0xffff) {
        if (pCVar10->nHeight != snapshot_base_height) {
          __assert_fail("index_new.nHeight == snapshot_base_height",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                        ,0x17dc,
                        "SnapshotCompletionResult ChainstateManager::MaybeCompleteSnapshotValidation()"
                       );
        }
        _Var3._M_head_impl =
             (this->m_ibd_chainstate)._M_t.
             super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
             super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
             super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl;
        curr_height = (int)((ulong)((long)*(pointer *)((long)&(_Var3._M_head_impl)->m_chain + 8) -
                                   *(long *)&((_Var3._M_head_impl)->m_chain).vChain) >> 3) + -1;
        if (snapshot_base_height != curr_height) {
          __assert_fail("snapshot_base_height == curr_height",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                        ,0x17e0,
                        "SnapshotCompletionResult ChainstateManager::MaybeCompleteSnapshotValidation()"
                       );
        }
        pCVar9 = (this->m_snapshot_chainstate)._M_t.
                 super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
                 super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
                 super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl;
        if ((pCVar9 == (Chainstate *)0x0) || (pCVar9->m_disabled == true)) {
          __assert_fail("this->IsUsable(m_snapshot_chainstate.get())",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                        ,0x17e2,
                        "SnapshotCompletionResult ChainstateManager::MaybeCompleteSnapshotValidation()"
                       );
        }
        GetAll((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)&maybe_ibd_stats,this);
        if (maybe_ibd_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>._M_payload.
            super__Optional_payload_base<kernel::CCoinsStats>._M_payload._8_8_ -
            maybe_ibd_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>._M_payload.
            super__Optional_payload_base<kernel::CCoinsStats>._M_payload._0_8_ != 0x10) {
          __assert_fail("this->GetAll().size() == 2",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                        ,0x17e3,
                        "SnapshotCompletionResult ChainstateManager::MaybeCompleteSnapshotValidation()"
                       );
        }
        if (maybe_ibd_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>._M_payload.
            super__Optional_payload_base<kernel::CCoinsStats>._M_payload._0_8_ != 0) {
          operator_delete((void *)maybe_ibd_stats.
                                  super__Optional_base<kernel::CCoinsStats,_true,_true>._M_payload.
                                  super__Optional_payload_base<kernel::CCoinsStats>._M_payload._0_8_
                          ,maybe_ibd_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>.
                           _M_payload.super__Optional_payload_base<kernel::CCoinsStats>._M_payload.
                           _16_8_ - maybe_ibd_stats.
                                    super__Optional_base<kernel::CCoinsStats,_true,_true>._M_payload
                                    .super__Optional_payload_base<kernel::CCoinsStats>._M_payload.
                                    _0_8_);
        }
        puVar14 = inline_assertion_check<true,std::unique_ptr<CoinsViews,std::default_delete<CoinsViews>>&>
                            (&((this->m_ibd_chainstate)._M_t.
                               super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>.
                               _M_t.
                               super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>
                               .super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl)->
                              m_coins_views,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.h"
                             ,0x271,"CoinsDB","m_coins_views");
        view = (puVar14->_M_t).super___uniq_ptr_impl<CoinsViews,_std::default_delete<CoinsViews>_>.
               _M_t.super__Tuple_impl<0UL,_CoinsViews_*,_std::default_delete<CoinsViews>_>.
               super__Head_base<0UL,_CoinsViews_*,_false>._M_head_impl;
        Chainstate::ForceFlushStateToDisk
                  ((this->m_ibd_chainstate)._M_t.
                   super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
                   super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
                   super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl);
        pCVar6 = (this->m_options).chainparams;
        pAVar16 = (pCVar6->m_assumeutxo_data).
                  super__Vector_base<AssumeutxoData,_std::allocator<AssumeutxoData>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pAVar7 = (pCVar6->m_assumeutxo_data).
                 super__Vector_base<AssumeutxoData,_std::allocator<AssumeutxoData>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if (pAVar16 == pAVar7) {
LAB_00af4b2d:
          local_70 = '\0';
        }
        else {
          iVar1 = pAVar16->height;
          while (iVar1 != curr_height) {
            pAVar16 = pAVar16 + 1;
            if (pAVar16 == pAVar7) goto LAB_00af4b2d;
            iVar1 = pAVar16->height;
          }
          puVar17 = &local_c0;
          for (lVar15 = 10; lVar15 != 0; lVar15 = lVar15 + -1) {
            *puVar17 = *(undefined8 *)pAVar16;
            pAVar16 = (pointer)((long)pAVar16 + ((ulong)bVar18 * -4 + 2) * 4);
            puVar17 = puVar17 + (ulong)bVar18 * -2 + 1;
          }
          local_70 = '\x01';
        }
        if (local_70 == '\0') {
          source_file_02._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
          ;
          source_file_02._M_len = 0x5e;
          logging_function_02._M_str = "MaybeCompleteSnapshotValidation";
          logging_function_02._M_len = 0x1f;
          LogPrintFormatInternal<int>
                    (logging_function_02,source_file_02,0x17eb,ALL,Info,
                     (ConstevalFormatString<1U>)0xfd66b9,&curr_height);
          MaybeCompleteSnapshotValidation::anon_class_24_3_af36e733::operator()
                    (&handle_invalid_snapshot);
          SVar8 = MISSING_CHAINPARAMS;
        }
        else {
          maybe_ibd_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>._M_payload.
          super__Optional_payload_base<kernel::CCoinsStats>._M_engaged = false;
          source_file_00._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
          ;
          source_file_00._M_len = 0x5e;
          logging_function_00._M_str = "MaybeCompleteSnapshotValidation";
          logging_function_00._M_len = 0x1f;
          LogPrintFormatInternal<>
                    (logging_function_00,source_file_00,0x17f3,ALL,Info,
                     (ConstevalFormatString<0U>)0xfd670f);
          local_298._8_8_ = 0;
          local_298._M_unused._M_object = this->m_interrupt;
          pcStack_280 = std::
                        _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp:6137:13)>
                        ::_M_invoke;
          local_288 = std::
                      _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp:6137:13)>
                      ::_M_manager;
          kernel::ComputeUTXOStats
                    ((optional<kernel::CCoinsStats> *)local_270,HASH_SERIALIZED,(CCoinsView *)view,
                     &this->m_blockman,(function<void_()> *)&local_298);
          memcpy(&maybe_ibd_stats,(string *)local_270,0xd8);
          if (local_288 != (code *)0x0) {
            (*local_288)(&local_298,&local_298,3);
          }
          if (maybe_ibd_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>._M_payload.
              super__Optional_payload_base<kernel::CCoinsStats>._M_engaged == false) {
            source_file_03._M_str =
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
            ;
            source_file_03._M_len = 0x5e;
            logging_function_03._M_str = "MaybeCompleteSnapshotValidation";
            logging_function_03._M_len = 0x1f;
            LogPrintFormatInternal<>
                      (logging_function_03,source_file_03,0x1800,ALL,Info,
                       (ConstevalFormatString<0U>)0xfd677f);
            MaybeCompleteSnapshotValidation::anon_class_24_3_af36e733::operator()
                      (&handle_invalid_snapshot);
            SVar8 = STATS_FAILED;
          }
          else {
            auVar22[0] = -(local_c0._4_1_ ==
                          maybe_ibd_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>.
                          _M_payload.super__Optional_payload_base<kernel::CCoinsStats>._M_payload.
                          _M_value.hashSerialized.super_base_blob<256U>.m_data._M_elems[0]);
            auVar22[1] = -(local_c0._5_1_ ==
                          maybe_ibd_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>.
                          _M_payload.super__Optional_payload_base<kernel::CCoinsStats>._M_payload.
                          _M_value.hashSerialized.super_base_blob<256U>.m_data._M_elems[1]);
            auVar22[2] = -(local_c0._6_1_ ==
                          maybe_ibd_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>.
                          _M_payload.super__Optional_payload_base<kernel::CCoinsStats>._M_payload.
                          _M_value.hashSerialized.super_base_blob<256U>.m_data._M_elems[2]);
            auVar22[3] = -(local_c0._7_1_ ==
                          maybe_ibd_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>.
                          _M_payload.super__Optional_payload_base<kernel::CCoinsStats>._M_payload.
                          _M_value.hashSerialized.super_base_blob<256U>.m_data._M_elems[3]);
            auVar22[4] = -(uStack_b8 ==
                          maybe_ibd_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>.
                          _M_payload.super__Optional_payload_base<kernel::CCoinsStats>._M_payload.
                          _M_value.hashSerialized.super_base_blob<256U>.m_data._M_elems[4]);
            auVar22[5] = -(uStack_b7 ==
                          maybe_ibd_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>.
                          _M_payload.super__Optional_payload_base<kernel::CCoinsStats>._M_payload.
                          _M_value.hashSerialized.super_base_blob<256U>.m_data._M_elems[5]);
            auVar22[6] = -(uStack_b6 ==
                          maybe_ibd_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>.
                          _M_payload.super__Optional_payload_base<kernel::CCoinsStats>._M_payload.
                          _M_value.hashSerialized.super_base_blob<256U>.m_data._M_elems[6]);
            auVar22[7] = -(uStack_b5 ==
                          maybe_ibd_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>.
                          _M_payload.super__Optional_payload_base<kernel::CCoinsStats>._M_payload.
                          _M_value.hashSerialized.super_base_blob<256U>.m_data._M_elems[7]);
            auVar22[8] = -(uStack_b4 ==
                          maybe_ibd_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>.
                          _M_payload.super__Optional_payload_base<kernel::CCoinsStats>._M_payload.
                          _M_value.hashSerialized.super_base_blob<256U>.m_data._M_elems[8]);
            auVar22[9] = -(uStack_b3 ==
                          maybe_ibd_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>.
                          _M_payload.super__Optional_payload_base<kernel::CCoinsStats>._M_payload.
                          _M_value.hashSerialized.super_base_blob<256U>.m_data._M_elems[9]);
            auVar22[10] = -(uStack_b2 ==
                           maybe_ibd_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>.
                           _M_payload.super__Optional_payload_base<kernel::CCoinsStats>._M_payload.
                           _M_value.hashSerialized.super_base_blob<256U>.m_data._M_elems[10]);
            auVar22[0xb] = -(uStack_b1 ==
                            maybe_ibd_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>.
                            _M_payload.super__Optional_payload_base<kernel::CCoinsStats>._M_payload.
                            _M_value.hashSerialized.super_base_blob<256U>.m_data._M_elems[0xb]);
            auVar22[0xc] = -(uStack_b0 ==
                            maybe_ibd_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>.
                            _M_payload.super__Optional_payload_base<kernel::CCoinsStats>._M_payload.
                            _M_value.hashSerialized.super_base_blob<256U>.m_data._M_elems[0xc]);
            auVar22[0xd] = -(uStack_af ==
                            maybe_ibd_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>.
                            _M_payload.super__Optional_payload_base<kernel::CCoinsStats>._M_payload.
                            _M_value.hashSerialized.super_base_blob<256U>.m_data._M_elems[0xd]);
            auVar22[0xe] = -(uStack_ae ==
                            maybe_ibd_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>.
                            _M_payload.super__Optional_payload_base<kernel::CCoinsStats>._M_payload.
                            _M_value.hashSerialized.super_base_blob<256U>.m_data._M_elems[0xe]);
            auVar22[0xf] = -(uStack_ad ==
                            maybe_ibd_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>.
                            _M_payload.super__Optional_payload_base<kernel::CCoinsStats>._M_payload.
                            _M_value.hashSerialized.super_base_blob<256U>.m_data._M_elems[0xf]);
            auVar20[0] = -(local_ac ==
                          maybe_ibd_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>.
                          _M_payload.super__Optional_payload_base<kernel::CCoinsStats>._M_payload.
                          _M_value.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x10]);
            auVar20[1] = -(uStack_ab ==
                          maybe_ibd_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>.
                          _M_payload.super__Optional_payload_base<kernel::CCoinsStats>._M_payload.
                          _M_value.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x11]);
            auVar20[2] = -(uStack_aa ==
                          maybe_ibd_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>.
                          _M_payload.super__Optional_payload_base<kernel::CCoinsStats>._M_payload.
                          _M_value.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x12]);
            auVar20[3] = -(uStack_a9 ==
                          maybe_ibd_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>.
                          _M_payload.super__Optional_payload_base<kernel::CCoinsStats>._M_payload.
                          _M_value.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x13]);
            auVar20[4] = -(uStack_a8 ==
                          maybe_ibd_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>.
                          _M_payload.super__Optional_payload_base<kernel::CCoinsStats>._M_payload.
                          _M_value.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x14]);
            auVar20[5] = -(uStack_a7 ==
                          maybe_ibd_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>.
                          _M_payload.super__Optional_payload_base<kernel::CCoinsStats>._M_payload.
                          _M_value.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x15]);
            auVar20[6] = -(uStack_a6 ==
                          maybe_ibd_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>.
                          _M_payload.super__Optional_payload_base<kernel::CCoinsStats>._M_payload.
                          _M_value.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x16]);
            auVar20[7] = -(uStack_a5 ==
                          maybe_ibd_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>.
                          _M_payload.super__Optional_payload_base<kernel::CCoinsStats>._M_payload.
                          _M_value.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x17]);
            auVar20[8] = -(uStack_a4 ==
                          maybe_ibd_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>.
                          _M_payload.super__Optional_payload_base<kernel::CCoinsStats>._M_payload.
                          _M_value.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x18]);
            auVar20[9] = -(uStack_a3 ==
                          maybe_ibd_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>.
                          _M_payload.super__Optional_payload_base<kernel::CCoinsStats>._M_payload.
                          _M_value.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x19]);
            auVar20[10] = -(uStack_a2 ==
                           maybe_ibd_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>.
                           _M_payload.super__Optional_payload_base<kernel::CCoinsStats>._M_payload.
                           _M_value.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x1a]);
            auVar20[0xb] = -(uStack_a1 ==
                            maybe_ibd_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>.
                            _M_payload.super__Optional_payload_base<kernel::CCoinsStats>._M_payload.
                            _M_value.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x1b]);
            auVar20[0xc] = -(uStack_a0 ==
                            maybe_ibd_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>.
                            _M_payload.super__Optional_payload_base<kernel::CCoinsStats>._M_payload.
                            _M_value.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x1c]);
            auVar20[0xd] = -(uStack_9f ==
                            maybe_ibd_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>.
                            _M_payload.super__Optional_payload_base<kernel::CCoinsStats>._M_payload.
                            _M_value.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x1d]);
            auVar20[0xe] = -(uStack_9e ==
                            maybe_ibd_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>.
                            _M_payload.super__Optional_payload_base<kernel::CCoinsStats>._M_payload.
                            _M_value.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x1e]);
            auVar20[0xf] = -(uStack_9d ==
                            maybe_ibd_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>.
                            _M_payload.super__Optional_payload_base<kernel::CCoinsStats>._M_payload.
                            _M_value.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x1f]);
            auVar20 = auVar20 & auVar22;
            if ((ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe |
                        (ushort)(byte)(auVar20[0xf] >> 7) << 0xf) == 0xffff) {
              base_blob<256u>::ToString_abi_cxx11_((string *)local_270,&snapshot_blockhash);
              source_file_04._M_str =
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
              ;
              source_file_04._M_len = 0x5e;
              logging_function_04._M_str = "MaybeCompleteSnapshotValidation";
              logging_function_04._M_len = 0x1f;
              LogPrintFormatInternal<std::__cxx11::string>
                        (logging_function_04,source_file_04,0x1818,ALL,Info,
                         (ConstevalFormatString<1U>)0xfd67ee,(string *)local_270);
              if ((undefined1 *)local_270._0_8_ != local_270 + 0x10) {
                operator_delete((void *)local_270._0_8_,local_270._16_8_ + 1);
              }
              ((this->m_ibd_chainstate)._M_t.
               super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
               super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
               super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl)->m_disabled = true;
              MaybeRebalanceCaches(this);
              SVar8 = SUCCESS;
            }
            else {
              base_blob<256u>::ToString_abi_cxx11_
                        ((string *)local_270,
                         (void *)((long)&maybe_ibd_stats.
                                         super__Optional_base<kernel::CCoinsStats,_true,_true>.
                                         _M_payload.
                                         super__Optional_payload_base<kernel::CCoinsStats>.
                                         _M_payload + 0x40));
              base_blob<256u>::ToString_abi_cxx11_
                        ((string *)&local_298,(void *)((long)&local_c0 + 4));
              source_file_01._M_str =
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
              ;
              source_file_01._M_len = 0x5e;
              logging_function_01._M_str = "MaybeCompleteSnapshotValidation";
              logging_function_01._M_len = 0x1f;
              LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
                        (logging_function_01,source_file_01,0x1812,ALL,Info,
                         (ConstevalFormatString<2U>)0xfd67bc,(string *)local_270,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_298);
              if ((code **)local_298._M_unused._0_8_ != &local_288) {
                operator_delete(local_298._M_unused._M_object,(ulong)(local_288 + 1));
              }
              if ((undefined1 *)local_270._0_8_ != local_270 + 0x10) {
                operator_delete((void *)local_270._0_8_,local_270._16_8_ + 1);
              }
              MaybeCompleteSnapshotValidation::anon_class_24_3_af36e733::operator()
                        (&handle_invalid_snapshot);
              SVar8 = HASH_MISMATCH;
            }
          }
        }
      }
      else {
        CBlockIndex::ToString_abi_cxx11_((string *)&maybe_ibd_stats,pCVar10);
        base_blob<256u>::ToString_abi_cxx11_((string *)local_270,&snapshot_blockhash);
        source_file._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
        ;
        source_file._M_len = 0x5e;
        logging_function._M_str = "MaybeCompleteSnapshotValidation";
        logging_function._M_len = 0x1f;
        LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string,int>
                  (logging_function,source_file,0x17d7,ALL,Info,(ConstevalFormatString<3U>)0xfd65b3,
                   (string *)&maybe_ibd_stats,(string *)local_270,&snapshot_base_height);
        if ((undefined1 *)local_270._0_8_ != local_270 + 0x10) {
          operator_delete((void *)local_270._0_8_,local_270._16_8_ + 1);
        }
        if ((undefined1 *)
            maybe_ibd_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>._M_payload.
            super__Optional_payload_base<kernel::CCoinsStats>._M_payload._0_8_ !=
            (undefined1 *)
            ((long)&maybe_ibd_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>._M_payload
                    .super__Optional_payload_base<kernel::CCoinsStats>._M_payload + 0x10)) {
          operator_delete((void *)maybe_ibd_stats.
                                  super__Optional_base<kernel::CCoinsStats,_true,_true>._M_payload.
                                  super__Optional_payload_base<kernel::CCoinsStats>._M_payload._0_8_
                          ,maybe_ibd_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>.
                           _M_payload.super__Optional_payload_base<kernel::CCoinsStats>._M_payload.
                           _16_8_ + 1);
        }
        MaybeCompleteSnapshotValidation::anon_class_24_3_af36e733::operator()
                  (&handle_invalid_snapshot);
        SVar8 = BASE_BLOCKHASH_MISMATCH;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return SVar8;
  }
  __stack_chk_fail();
}

Assistant:

SnapshotCompletionResult ChainstateManager::MaybeCompleteSnapshotValidation()
{
    AssertLockHeld(cs_main);
    if (m_ibd_chainstate.get() == &this->ActiveChainstate() ||
            !this->IsUsable(m_snapshot_chainstate.get()) ||
            !this->IsUsable(m_ibd_chainstate.get()) ||
            !m_ibd_chainstate->m_chain.Tip()) {
       // Nothing to do - this function only applies to the background
       // validation chainstate.
       return SnapshotCompletionResult::SKIPPED;
    }
    const int snapshot_tip_height = this->ActiveHeight();
    const int snapshot_base_height = *Assert(this->GetSnapshotBaseHeight());
    const CBlockIndex& index_new = *Assert(m_ibd_chainstate->m_chain.Tip());

    if (index_new.nHeight < snapshot_base_height) {
        // Background IBD not complete yet.
        return SnapshotCompletionResult::SKIPPED;
    }

    assert(SnapshotBlockhash());
    uint256 snapshot_blockhash = *Assert(SnapshotBlockhash());

    auto handle_invalid_snapshot = [&]() EXCLUSIVE_LOCKS_REQUIRED(::cs_main) {
        bilingual_str user_error = strprintf(_(
            "%s failed to validate the -assumeutxo snapshot state. "
            "This indicates a hardware problem, or a bug in the software, or a "
            "bad software modification that allowed an invalid snapshot to be "
            "loaded. As a result of this, the node will shut down and stop using any "
            "state that was built on the snapshot, resetting the chain height "
            "from %d to %d. On the next "
            "restart, the node will resume syncing from %d "
            "without using any snapshot data. "
            "Please report this incident to %s, including how you obtained the snapshot. "
            "The invalid snapshot chainstate will be left on disk in case it is "
            "helpful in diagnosing the issue that caused this error."),
            PACKAGE_NAME, snapshot_tip_height, snapshot_base_height, snapshot_base_height, PACKAGE_BUGREPORT
        );

        LogError("[snapshot] !!! %s\n", user_error.original);
        LogError("[snapshot] deleting snapshot, reverting to validated chain, and stopping node\n");

        m_active_chainstate = m_ibd_chainstate.get();
        m_snapshot_chainstate->m_disabled = true;
        assert(!this->IsUsable(m_snapshot_chainstate.get()));
        assert(this->IsUsable(m_ibd_chainstate.get()));

        auto rename_result = m_snapshot_chainstate->InvalidateCoinsDBOnDisk();
        if (!rename_result) {
            user_error = strprintf(Untranslated("%s\n%s"), user_error, util::ErrorString(rename_result));
        }

        GetNotifications().fatalError(user_error);
    };

    if (index_new.GetBlockHash() != snapshot_blockhash) {
        LogPrintf("[snapshot] supposed base block %s does not match the "
          "snapshot base block %s (height %d). Snapshot is not valid.\n",
          index_new.ToString(), snapshot_blockhash.ToString(), snapshot_base_height);
        handle_invalid_snapshot();
        return SnapshotCompletionResult::BASE_BLOCKHASH_MISMATCH;
    }

    assert(index_new.nHeight == snapshot_base_height);

    int curr_height = m_ibd_chainstate->m_chain.Height();

    assert(snapshot_base_height == curr_height);
    assert(snapshot_base_height == index_new.nHeight);
    assert(this->IsUsable(m_snapshot_chainstate.get()));
    assert(this->GetAll().size() == 2);

    CCoinsViewDB& ibd_coins_db = m_ibd_chainstate->CoinsDB();
    m_ibd_chainstate->ForceFlushStateToDisk();

    const auto& maybe_au_data = m_options.chainparams.AssumeutxoForHeight(curr_height);
    if (!maybe_au_data) {
        LogPrintf("[snapshot] assumeutxo data not found for height "
            "(%d) - refusing to validate snapshot\n", curr_height);
        handle_invalid_snapshot();
        return SnapshotCompletionResult::MISSING_CHAINPARAMS;
    }

    const AssumeutxoData& au_data = *maybe_au_data;
    std::optional<CCoinsStats> maybe_ibd_stats;
    LogPrintf("[snapshot] computing UTXO stats for background chainstate to validate "
        "snapshot - this could take a few minutes\n");
    try {
        maybe_ibd_stats = ComputeUTXOStats(
            CoinStatsHashType::HASH_SERIALIZED,
            &ibd_coins_db,
            m_blockman,
            [&interrupt = m_interrupt] { SnapshotUTXOHashBreakpoint(interrupt); });
    } catch (StopHashingException const&) {
        return SnapshotCompletionResult::STATS_FAILED;
    }

    // XXX note that this function is slow and will hold cs_main for potentially minutes.
    if (!maybe_ibd_stats) {
        LogPrintf("[snapshot] failed to generate stats for validation coins db\n");
        // While this isn't a problem with the snapshot per se, this condition
        // prevents us from validating the snapshot, so we should shut down and let the
        // user handle the issue manually.
        handle_invalid_snapshot();
        return SnapshotCompletionResult::STATS_FAILED;
    }
    const auto& ibd_stats = *maybe_ibd_stats;

    // Compare the background validation chainstate's UTXO set hash against the hard-coded
    // assumeutxo hash we expect.
    //
    // TODO: For belt-and-suspenders, we could cache the UTXO set
    // hash for the snapshot when it's loaded in its chainstate's leveldb. We could then
    // reference that here for an additional check.
    if (AssumeutxoHash{ibd_stats.hashSerialized} != au_data.hash_serialized) {
        LogPrintf("[snapshot] hash mismatch: actual=%s, expected=%s\n",
            ibd_stats.hashSerialized.ToString(),
            au_data.hash_serialized.ToString());
        handle_invalid_snapshot();
        return SnapshotCompletionResult::HASH_MISMATCH;
    }

    LogPrintf("[snapshot] snapshot beginning at %s has been fully validated\n",
        snapshot_blockhash.ToString());

    m_ibd_chainstate->m_disabled = true;
    this->MaybeRebalanceCaches();

    return SnapshotCompletionResult::SUCCESS;
}